

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

string * anon_unknown.dwarf_5450::xmlEscape(string *__return_storage_ptr__,string *source)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  char *pcVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (source->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + source->_M_string_length);
  uVar3 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x10f060,0);
  do {
    if (uVar3 == 0xffffffffffffffff) {
      return __return_storage_ptr__;
    }
    cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[uVar3];
    pcVar4 = "&gt;";
    if (cVar1 == '>') {
LAB_00108d5b:
      std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar3,(char *)0x1,(ulong)pcVar4);
    }
    else if (cVar1 == '<') {
      pcVar4 = "&lt;";
      goto LAB_00108d5b;
    }
    uVar3 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x10f060,0);
  } while( true );
}

Assistant:

std::string xmlEscape(std::string const& source)
    {
        string result = source;
        size_t pos = result.find_first_of("<>");
        while (pos != string::npos)
        {
            if (result[pos] == '<')
                result.replace(pos, 1, "&lt;");
            else if (result[pos] == '>')
                result.replace(pos, 1, "&gt;");
            pos = result.find_first_of("<>");
        }

        return result;
    }